

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.cpp
# Opt level: O1

int mbedtls_mpi_safe_cond_swap(mbedtls_mpi *X,mbedtls_mpi *Y,uchar swap)

{
  undefined2 uVar1;
  undefined2 uVar2;
  ushort uVar3;
  ushort uVar4;
  int iVar5;
  ulong uVar6;
  
  iVar5 = 0;
  if (X != Y) {
    uVar6 = swap ^ mbedtls_ct_zero;
    iVar5 = mbedtls_mpi_grow(X,(ulong)Y->n);
    if ((iVar5 == 0) && (iVar5 = mbedtls_mpi_grow(Y,(ulong)X->n), iVar5 == 0)) {
      uVar6 = -(uVar6 >> 1) | -uVar6;
      uVar1 = Y->s;
      uVar4 = X->s + 1;
      uVar3 = (ushort)((long)uVar6 >> 0x3f);
      X->s = (~((ushort)mbedtls_ct_zero ^ uVar3) & uVar4 | uVar1 + 1 & uVar3) - 1;
      uVar2 = Y->s;
      Y->s = (uVar4 & uVar3 | ~((ushort)mbedtls_ct_zero ^ uVar3) & uVar2 + 1) - 1;
      mbedtls_mpi_core_cond_swap(X->p,Y->p,(ulong)X->n,(long)uVar6 >> 0x3f);
      iVar5 = 0;
    }
  }
  return iVar5;
}

Assistant:

int mbedtls_mpi_safe_cond_swap(mbedtls_mpi *X,
                               mbedtls_mpi *Y,
                               unsigned char swap)
{
    int ret = 0;
    int s;

    if (X == Y) {
        return 0;
    }

    mbedtls_ct_condition_t do_swap = mbedtls_ct_bool(swap);

    MBEDTLS_MPI_CHK(mbedtls_mpi_grow(X, Y->n));
    MBEDTLS_MPI_CHK(mbedtls_mpi_grow(Y, X->n));

    s = X->s;
    X->s = mbedtls_ct_mpi_sign_if(do_swap, Y->s, X->s);
    Y->s = mbedtls_ct_mpi_sign_if(do_swap, s, Y->s);

    mbedtls_mpi_core_cond_swap(X->p, Y->p, X->n, do_swap);

cleanup:
    return ret;
}